

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

size_t whisper_sched_size(whisper_sched *allocr)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  size_t sVar5;
  
  sVar5 = (long)(allocr->meta).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(allocr->meta).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  iVar1 = ggml_backend_sched_get_n_backends(allocr->sched);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      uVar3 = ggml_backend_sched_get_backend(allocr->sched,iVar1);
      lVar4 = ggml_backend_sched_get_buffer_size(allocr->sched,uVar3);
      sVar5 = sVar5 + lVar4;
      iVar1 = iVar1 + 1;
      iVar2 = ggml_backend_sched_get_n_backends(allocr->sched);
    } while (iVar1 < iVar2);
  }
  return sVar5;
}

Assistant:

static size_t whisper_sched_size(struct whisper_sched & allocr) {
    size_t size = allocr.meta.size();
    for (int i = 0; i < ggml_backend_sched_get_n_backends(allocr.sched); ++i) {
        ggml_backend_t backend = ggml_backend_sched_get_backend(allocr.sched, i);
        size += ggml_backend_sched_get_buffer_size(allocr.sched, backend);
    }
    return size;
}